

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_bind.h
# Opt level: O0

void pybind11::detail::
     vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>
               (enable_if_t<is_copy_constructible<typename_vector<TangleView>::value_type>::value,_pybind11::class_<std::vector<TangleView>,_std::unique_ptr<std::vector<TangleView>_>_>_>
                *cl)

{
  anon_class_1_0_00000001 *in_RDI;
  anon_class_1_0_00000001 wrap_i;
  arg local_a8 [2];
  char (*in_stack_ffffffffffffff78) [42];
  type *in_stack_ffffffffffffff80;
  arg *in_stack_ffffffffffffff88;
  type *in_stack_ffffffffffffff90;
  arg *in_stack_ffffffffffffff98;
  type *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  arg local_38;
  arg local_20;
  anon_class_1_0_00000001 *local_8;
  
  local_8 = in_RDI;
  pybind11::arg::arg(&local_20,"x");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,TangleView_const&)_1_,pybind11::arg,char[35]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (type *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (char (*) [35])in_stack_ffffffffffffff80);
  init<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(pybind11::iterable)_1_,pybind11::detail::initimpl::factory<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(pybind11::iterable)_1_,pybind11::detail::void_type(*)(),std::vector<TangleView,std::allocator<TangleView>>*(pybind11::iterable),pybind11::detail::void_type()>>
            (in_RDI);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(pybind11::iterable)_1_,pybind11::detail::void_type(*)(),std::vector<TangleView,std::allocator<TangleView>>*(pybind11::iterable),pybind11::detail::void_type()>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)local_8,
             (factory<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_bioinfologics[P]sdg_deps_pybind11_stl_bind_h:131:17),_pybind11::detail::void_type_(*)(),_std::vector<TangleView,_std::allocator<TangleView>_>_*(pybind11::iterable),_pybind11::detail::void_type_()>
              *)in_RDI);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&)_1_,char[19]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (type *)in_stack_ffffffffffffff80,(char (*) [19])in_stack_ffffffffffffff78);
  pybind11::arg::arg(&local_38,"L");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,std::vector<TangleView,std::allocator<TangleView>>const&)_1_,pybind11::arg,char[61]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (type *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (char (*) [61])in_stack_ffffffffffffff80);
  pybind11::arg::arg((arg *)&stack0xffffffffffffffb0,"L");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,pybind11::iterable)_1_,pybind11::arg,char[61]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (type *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (char (*) [61])in_stack_ffffffffffffff80);
  pybind11::arg::arg((arg *)&stack0xffffffffffffff98,"i");
  pybind11::arg::arg((arg *)&stack0xffffffffffffff88,"x");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,long,TangleView_const&)_1_,pybind11::arg,pybind11::arg,char[36]>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,(arg *)in_stack_ffffffffffffff90,
             (char (*) [36])in_stack_ffffffffffffff88);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&)_2_,char[32]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (type *)in_stack_ffffffffffffff80,(char (*) [32])in_stack_ffffffffffffff78);
  pybind11::arg::arg((arg *)&local_a8[1].field_0x8,"i");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,long)_1_,pybind11::arg,char[42]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (type *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (char (*) [42])in_stack_ffffffffffffff80);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,long,TangleView_const&)_2_>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (type *)in_stack_ffffffffffffff80);
  pybind11::arg::arg(local_a8,"s");
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>const&,pybind11::slice)_1_,pybind11::arg,char[44]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (char (*) [44])in_stack_ffffffffffffff80);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,pybind11::slice,std::vector<TangleView,std::allocator<TangleView>>const&)_1_,char[42]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (type *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,long)_2_,char[40]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (type *)in_stack_ffffffffffffff80,(char (*) [40])in_stack_ffffffffffffff78);
  class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
  ::
  def<pybind11::detail::vector_modifiers<std::vector<TangleView,std::allocator<TangleView>>,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>(std::enable_if<is_copy_constructible<std::vector<TangleView,std::allocator<TangleView>>::value_type>::value,pybind11::class_<std::vector<TangleView,std::allocator<TangleView>>,std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>>::type&)::_lambda(std::vector<TangleView,std::allocator<TangleView>>&,pybind11::slice)_1_,char[42]>
            ((class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
              *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

void vector_modifiers(enable_if_t<is_copy_constructible<typename Vector::value_type>::value, Class_> &cl) {
    using T = typename Vector::value_type;
    using SizeType = typename Vector::size_type;
    using DiffType = typename Vector::difference_type;

    auto wrap_i = [](DiffType i, SizeType n) {
        if (i < 0)
            i += n;
        if (i < 0 || (SizeType)i >= n)
            throw index_error();
        return i;
    };

    cl.def("append",
           [](Vector &v, const T &value) { v.push_back(value); },
           arg("x"),
           "Add an item to the end of the list");

    cl.def(init([](iterable it) {
        auto v = std::unique_ptr<Vector>(new Vector());
        v->reserve(len_hint(it));
        for (handle h : it)
           v->push_back(h.cast<T>());
        return v.release();
    }));

    cl.def("clear",
        [](Vector &v) {
            v.clear();
        },
        "Clear the contents"
    );

    cl.def("extend",
       [](Vector &v, const Vector &src) {
           v.insert(v.end(), src.begin(), src.end());
       },
       arg("L"),
       "Extend the list by appending all the items in the given list"
    );

    cl.def("extend",
       [](Vector &v, iterable it) {
           const size_t old_size = v.size();
           v.reserve(old_size + len_hint(it));
           try {
               for (handle h : it) {
                   v.push_back(h.cast<T>());
               }
           } catch (const cast_error &) {
               v.erase(v.begin() + static_cast<typename Vector::difference_type>(old_size), v.end());
               try {
                   v.shrink_to_fit();
               } catch (const std::exception &) {
                   // Do nothing
               }
               throw;
           }
       },
       arg("L"),
       "Extend the list by appending all the items in the given list"
    );

    cl.def("insert",
        [](Vector &v, DiffType i, const T &x) {
            // Can't use wrap_i; i == v.size() is OK
            if (i < 0)
                i += v.size();
            if (i < 0 || (SizeType)i > v.size())
                throw index_error();
            v.insert(v.begin() + i, x);
        },
        arg("i") , arg("x"),
        "Insert an item at a given position."
    );

    cl.def("pop",
        [](Vector &v) {
            if (v.empty())
                throw index_error();
            T t = v.back();
            v.pop_back();
            return t;
        },
        "Remove and return the last item"
    );

    cl.def("pop",
        [wrap_i](Vector &v, DiffType i) {
            i = wrap_i(i, v.size());
            T t = v[(SizeType) i];
            v.erase(v.begin() + i);
            return t;
        },
        arg("i"),
        "Remove and return the item at index ``i``"
    );

    cl.def("__setitem__",
        [wrap_i](Vector &v, DiffType i, const T &t) {
            i = wrap_i(i, v.size());
            v[(SizeType)i] = t;
        }
    );

    /// Slicing protocol
    cl.def("__getitem__",
        [](const Vector &v, slice slice) -> Vector * {
            size_t start, stop, step, slicelength;

            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            auto *seq = new Vector();
            seq->reserve((size_t) slicelength);

            for (size_t i=0; i<slicelength; ++i) {
                seq->push_back(v[start]);
                start += step;
            }
            return seq;
        },
        arg("s"),
        "Retrieve list elements using a slice object"
    );

    cl.def("__setitem__",
        [](Vector &v, slice slice,  const Vector &value) {
            size_t start, stop, step, slicelength;
            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            if (slicelength != value.size())
                throw std::runtime_error("Left and right hand size of slice assignment have different sizes!");

            for (size_t i=0; i<slicelength; ++i) {
                v[start] = value[i];
                start += step;
            }
        },
        "Assign list elements using a slice object"
    );

    cl.def("__delitem__",
        [wrap_i](Vector &v, DiffType i) {
            i = wrap_i(i, v.size());
            v.erase(v.begin() + i);
        },
        "Delete the list elements at index ``i``"
    );

    cl.def("__delitem__",
        [](Vector &v, slice slice) {
            size_t start, stop, step, slicelength;

            if (!slice.compute(v.size(), &start, &stop, &step, &slicelength))
                throw error_already_set();

            if (step == 1 && false) {
                v.erase(v.begin() + (DiffType) start, v.begin() + DiffType(start + slicelength));
            } else {
                for (size_t i = 0; i < slicelength; ++i) {
                    v.erase(v.begin() + DiffType(start));
                    start += step - 1;
                }
            }
        },
        "Delete list elements using a slice object"
    );

}